

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_msg.c
# Opt level: O0

void mbedtls_ssl_buffering_free(mbedtls_ssl_context *ssl)

{
  mbedtls_ssl_handshake_params *hs;
  uint offset;
  mbedtls_ssl_context *ssl_local;
  
  if (ssl->handshake != (mbedtls_ssl_handshake_params *)0x0) {
    ssl_free_buffered_record(ssl);
    for (hs._4_4_ = 0; hs._4_4_ < 4; hs._4_4_ = hs._4_4_ + 1) {
      ssl_buffering_free_slot(ssl,(uint8_t)hs._4_4_);
    }
  }
  return;
}

Assistant:

void mbedtls_ssl_buffering_free(mbedtls_ssl_context *ssl)
{
    unsigned offset;
    mbedtls_ssl_handshake_params * const hs = ssl->handshake;

    if (hs == NULL) {
        return;
    }

    ssl_free_buffered_record(ssl);

    for (offset = 0; offset < MBEDTLS_SSL_MAX_BUFFERED_HS; offset++) {
        ssl_buffering_free_slot(ssl, offset);
    }
}